

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expected.h
# Opt level: O0

void __thiscall
Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Expected(Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Value *value)

{
  Value *value_local;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  yaml::Value::Value((Value *)this,value);
  this->has_value_ = true;
  return;
}

Assistant:

Expected(T &&value) : value_(std::move(value)), has_value_(true) {}